

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpRepeatedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  FieldEntry *pFVar3;
  ParseContext *p;
  MessageLite *x;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  unsigned_long uVar9;
  pointer puVar10;
  LogMessage *pLVar11;
  pointer puVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_240 [2];
  TcFieldData local_230 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_220;
  uint32_t local_214;
  ParseContext *pPStack_210;
  uint32_t next_tag_1;
  char *ptr2_1;
  unsigned_long size_1;
  RepeatedField<unsigned_int> *field_1;
  LogMessage local_1f0;
  Voidify local_1dd;
  unsigned_short local_1dc;
  unsigned_short local_1da;
  Nullable<const_char_*> local_1d8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ParseContext *pPStack_1c8;
  uint32_t next_tag;
  char *ptr2;
  unsigned_long size;
  RepeatedField<unsigned_long> *field;
  ushort local_1a4;
  ushort local_1a2;
  uint16_t rep;
  void *pvStack_1a0;
  uint16_t type_card;
  void *base;
  uint local_190;
  uint32_t local_18c;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_148;
  TcFieldData local_140;
  undefined1 local_131;
  FieldEntry *pFStack_130;
  bool always_return;
  TcParseTableBase *local_128;
  ParseContext *local_120;
  ParseContext *local_118;
  MessageLite *local_110;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _decoded_wiretype =
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6);
  local_18c = TcFieldData::tag((TcFieldData *)&msg_local);
  local_190 = local_18c & 7;
  if (local_190 == 2) {
    base = msg_local;
    pcVar8 = MpPackedFixed<true>((MessageLite *)ptr_local,(char *)ctx_local,
                                 (ParseContext *)table_local,(TcFieldData)msg_local,
                                 (TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar8;
  }
  pvStack_1a0 = MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  local_1a2 = _decoded_wiretype->type_card;
  local_1a4 = local_1a2 & 0x1c0;
  if (local_1a4 == 0xc0) {
    if (local_190 != 1) {
      field = (RepeatedField<unsigned_long> *)msg_local;
      pcVar8 = (char *)(**(code **)(hasbits_local + 0x30))
                                 (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
      return pcVar8;
    }
    size = (unsigned_long)
           MaybeCreateRepeatedFieldRefAt<unsigned_long,true>
                     (pvStack_1a0,(ulong)_decoded_wiretype->offset,(MessageLite *)ptr_local);
    ptr2 = (char *)0x8;
    pPStack_1c8 = ctx_local;
    do {
      ctx_local = pPStack_1c8;
      uVar9 = UnalignedLoad<unsigned_long>((char *)pPStack_1c8);
      puVar10 = RepeatedField<unsigned_long>::Add((RepeatedField<unsigned_long> *)size);
      *puVar10 = uVar9;
      ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local)
      ;
      if (((bVar4 ^ 0xffU) & 1) != 0) {
LAB_003ac291:
        pcVar8 = ptr_local;
        pPVar2 = ctx_local;
        TcFieldData::TcFieldData(local_230);
        if (*(ushort *)hasbits_local != 0) {
          uVar7 = (uint)entry;
          puVar13 = RefAt<unsigned_int>(pcVar8,(ulong)(uint)*(ushort *)hasbits_local);
          *puVar13 = uVar7 | *puVar13;
        }
        return (char *)pPVar2;
      }
      pPStack_1c8 = (ParseContext *)
                    ReadTag((char *)ctx_local,
                            (uint32_t *)((long)&absl_log_internal_check_op_result + 4),0);
      if (pPStack_1c8 == (ParseContext *)0x0) {
        pPStack_1c8 = (ParseContext *)0x0;
LAB_003ac360:
        pcVar8 = ptr_local;
        pPVar2 = ctx_local;
        pTVar1 = table_local;
        TcFieldData::TcFieldData((TcFieldData *)local_240);
        pcVar8 = Error((MessageLite *)pcVar8,(char *)pPVar2,(ParseContext *)pTVar1,
                       (TcFieldData)local_240[0],(TcParseTableBase *)hasbits_local,(uint64_t)entry);
        return pcVar8;
      }
    } while (absl_log_internal_check_op_result._4_4_ == local_18c);
  }
  else {
    local_1da = absl::lts_20250127::log_internal::GetReferenceableValue(local_1a4);
    local_1dc = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
    local_1d8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          (&local_1da,&local_1dc,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (local_1d8 != (Nullable<const_char_*>)0x0) {
      pcVar8 = absl::lts_20250127::implicit_cast<char_const*>(local_1d8);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7b7,pcVar8);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1f0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1dd,pLVar11);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1f0);
    }
    if (local_190 != 5) {
      field_1 = (RepeatedField<unsigned_int> *)msg_local;
      pcVar8 = (char *)(**(code **)(hasbits_local + 0x30))
                                 (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
      return pcVar8;
    }
    size_1 = (unsigned_long)
             MaybeCreateRepeatedFieldRefAt<unsigned_int,true>
                       (pvStack_1a0,(ulong)_decoded_wiretype->offset,(MessageLite *)ptr_local);
    ptr2_1 = (char *)0x4;
    pPStack_210 = ctx_local;
    do {
      ctx_local = pPStack_210;
      uVar7 = UnalignedLoad<unsigned_int>((char *)pPStack_210);
      puVar12 = RepeatedField<unsigned_int>::Add((RepeatedField<unsigned_int> *)size_1);
      *puVar12 = uVar7;
      ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local)
      ;
      if (((bVar4 ^ 0xffU) & 1) != 0) goto LAB_003ac291;
      pPStack_210 = (ParseContext *)ReadTag((char *)ctx_local,&local_214,0);
      if (pPStack_210 == (ParseContext *)0x0) {
        pPStack_210 = (ParseContext *)0x0;
        goto LAB_003ac360;
      }
    } while (local_214 == local_18c);
  }
  pcVar8 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)&local_220);
  local_108 = local_220;
  local_110 = (MessageLite *)pcVar8;
  local_118 = pPVar2;
  local_120 = (ParseContext *)pTVar1;
  local_128 = (TcParseTableBase *)hasbits_local;
  pFStack_130 = entry;
  local_131 = 0;
  bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar2);
  x = local_110;
  p = local_118;
  pPVar2 = local_120;
  if (!bVar4) {
    TcFieldData::TcFieldData(&local_140);
    if (local_128->has_bits_offset != 0) {
      uVar7 = (uint)pFStack_130;
      puVar13 = RefAt<unsigned_int>(x,(ulong)(uint)local_128->has_bits_offset);
      *puVar13 = uVar7 | *puVar13;
    }
    return (char *)p;
  }
  TcFieldData::TcFieldData(&local_148);
  pTVar1 = local_128;
  pFVar3 = pFStack_130;
  uVar5 = UnalignedLoad<unsigned_short>((char *)p);
  uVar14 = (ulong)(int)((uint)uVar5 & (uint)pTVar1->fast_idx_mask);
  if ((uVar14 & 7) == 0) {
    data_1.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar1,uVar14 >> 3)
    ;
    local_f8.data =
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
         (ulong)uVar5;
    UNRECOVERED_JUMPTABLE =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
    local_100.data = local_f8.data;
    pcVar8 = (*UNRECOVERED_JUMPTABLE)
                       (x,(char *)p,pPVar2,(TcFieldData)local_f8,pTVar1,(uint64_t)pFVar3);
    return pcVar8;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}